

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* mult_matrix_on_constant<double>
            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *a,double *C)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  allocator_type local_4a;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (a->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(a->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
           -0x5555555555555555;
  uVar6 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data) >> 3;
  iVar5 = (int)uVar6;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)iVar5,&local_49);
  iVar9 = (int)uVar10;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar9,&local_48,&local_4a);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0 < iVar9) {
    pvVar1 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      if (0 < iVar5) {
        lVar3 = *(long *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar4 = *(long *)&pvVar2[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar8 = 0;
        do {
          *(double *)(lVar4 + uVar8 * 8) = *(double *)(lVar3 + uVar8 * 8) * *C;
          uVar8 = uVar8 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar10 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > mult_matrix_on_constant(const std::vector<std::vector<T> >& a, const T& C){
    int n = a.size();
    int m = a[0].size();
    std::vector<std::vector<T> > ans(n, std::vector<T>(m));
    for (int i = 0; i < n; ++i)
        for (int j = 0; j < m; ++j)
            ans[i][j] = a[i][j]*C;
    return ans;
}